

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::ClassInitialize(void)

{
  undefined8 uVar1;
  __type _Var2;
  SystemToolsTranslationMap *this;
  char *pcVar3;
  ulong uVar4;
  bool local_9d1;
  allocator local_989;
  string local_988;
  string local_968;
  string local_948;
  allocator local_921;
  string local_920;
  undefined1 local_900 [8];
  string pwd_path;
  undefined1 local_8d8 [8];
  string cwd_str;
  undefined1 local_8b0 [8];
  string pwd_str;
  string pwd_changed;
  string cwd_changed;
  char *cwd;
  char buf [2048];
  char *pwd;
  allocator local_29;
  string local_28;
  
  this = (SystemToolsTranslationMap *)operator_new(0x30);
  SystemToolsTranslationMap::SystemToolsTranslationMap(this);
  TranslationMap = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_28,"/tmp/",&local_29);
  AddKeepPath(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  buf._2040_8_ = getenv("PWD");
  if (((char *)buf._2040_8_ != (char *)0x0) &&
     (pcVar3 = Getcwd((char *)&cwd,0x800), pcVar3 != (char *)0x0)) {
    std::__cxx11::string::string((string *)(pwd_changed.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(pwd_str.field_2._M_local_buf + 8));
    uVar1 = buf._2040_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_8b0,(char *)uVar1,(allocator *)(cwd_str.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(cwd_str.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_8d8,pcVar3,(allocator *)(pwd_path.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(pwd_path.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)local_900);
    uVar1 = buf._2040_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_920,(char *)uVar1,&local_921);
    Realpath(&local_920,(string *)local_900,(string *)0x0);
    std::__cxx11::string::~string((string *)&local_920);
    std::allocator<char>::~allocator((allocator<char> *)&local_921);
    while( true ) {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_8d8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_900);
      local_9d1 = false;
      if (_Var2) {
        local_9d1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_8d8,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_8b0);
      }
      if (local_9d1 == false) break;
      std::__cxx11::string::operator=
                ((string *)(pwd_changed.field_2._M_local_buf + 8),(string *)local_8d8);
      std::__cxx11::string::operator=
                ((string *)(pwd_str.field_2._M_local_buf + 8),(string *)local_8b0);
      GetFilenamePath(&local_948,(string *)local_8b0);
      std::__cxx11::string::operator=((string *)local_8b0,(string *)&local_948);
      std::__cxx11::string::~string((string *)&local_948);
      GetFilenamePath(&local_968,(string *)local_8d8);
      std::__cxx11::string::operator=((string *)local_8d8,(string *)&local_968);
      std::__cxx11::string::~string((string *)&local_968);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_988,pcVar3,&local_989);
      Realpath(&local_988,(string *)local_900,(string *)0x0);
      std::__cxx11::string::~string((string *)&local_988);
      std::allocator<char>::~allocator((allocator<char> *)&local_989);
    }
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
      AddTranslationPath((string *)((long)&pwd_changed.field_2 + 8),
                         (string *)((long)&pwd_str.field_2 + 8));
    }
    std::__cxx11::string::~string((string *)local_900);
    std::__cxx11::string::~string((string *)local_8d8);
    std::__cxx11::string::~string((string *)local_8b0);
    std::__cxx11::string::~string((string *)(pwd_str.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(pwd_changed.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void SystemTools::ClassInitialize()
{
#ifdef __VMS
  SetVMSFeature("DECC$FILENAME_UNIX_ONLY", 1);
#endif
  // Allocate the translation map first.
  SystemTools::TranslationMap = new SystemToolsTranslationMap;
#ifdef _WIN32
  SystemTools::PathCaseMap = new SystemToolsPathCaseMap;
#endif
#ifdef __CYGWIN__
  SystemTools::Cyg2Win32Map = new SystemToolsTranslationMap;
#endif

  // Add some special translation paths for unix.  These are not added
  // for windows because drive letters need to be maintained.  Also,
  // there are not sym-links and mount points on windows anyway.
#if !defined(_WIN32) || defined(__CYGWIN__)
  // The tmp path is frequently a logical path so always keep it:
  SystemTools::AddKeepPath("/tmp/");

  // If the current working directory is a logical path then keep the
  // logical name.
  if(const char* pwd = getenv("PWD"))
    {
    char buf[2048];
    if(const char* cwd = Getcwd(buf, 2048))
      {
      // The current working directory may be a logical path.  Find
      // the shortest logical path that still produces the correct
      // physical path.
      std::string cwd_changed;
      std::string pwd_changed;

      // Test progressively shorter logical-to-physical mappings.
      std::string pwd_str = pwd;
      std::string cwd_str = cwd;
      std::string pwd_path;
      Realpath(pwd, pwd_path);
      while(cwd_str == pwd_path && cwd_str != pwd_str)
        {
        // The current pair of paths is a working logical mapping.
        cwd_changed = cwd_str;
        pwd_changed = pwd_str;

        // Strip off one directory level and see if the logical
        // mapping still works.
        pwd_str = SystemTools::GetFilenamePath(pwd_str);
        cwd_str = SystemTools::GetFilenamePath(cwd_str);
        Realpath(pwd_str.c_str(), pwd_path);
        }

      // Add the translation to keep the logical path name.
      if(!cwd_changed.empty() && !pwd_changed.empty())
        {
        SystemTools::AddTranslationPath(cwd_changed,
                                        pwd_changed);
        }
      }
    }
#endif
}